

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void __thiscall
xray_re::xr_mesh_builder::remove_back_faces(xr_mesh_builder *this,float normal_tolerance)

{
  byte *pbVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  bool bVar11;
  uint uVar12;
  uint32_t uVar13;
  b_face_vec_it it;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  b_face *pbVar17;
  b_edge *pbVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  const_iterator __first;
  int iVar23;
  b_face *pbVar24;
  uint_fast32_t v1;
  pointer pbVar25;
  ulong uVar26;
  int side;
  pointer local_b8;
  void *local_b0;
  void *local_a8;
  uint local_9c;
  b_face *local_98;
  ulong local_90;
  xr_mesh_builder *local_88;
  b_face_vec *local_80;
  int local_74;
  ulong local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  vector<int,_std::allocator<int>_> sides;
  
  local_b0 = (void *)CONCAT44(local_b0._4_4_,normal_tolerance);
  generate_vertex_faces(this);
  lVar14 = (long)(this->m_faces).
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_faces).
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_80 = &this->m_faces;
  uVar21 = lVar14 >> 6;
  uVar20 = 0;
  local_b8 = (pointer)(-(ulong)(uVar21 >> 0x3e != 0) | lVar14 >> 4);
  local_a8 = operator_new__((ulong)local_b8);
  local_70 = uVar21;
  std::__fill_n_a<unsigned_int*,unsigned_long,unsigned_int>(local_a8,uVar21,&BAD_IDX);
  local_98 = (this->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = this;
  for (pbVar17 = (this->m_faces).
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar17 != local_98;
      pbVar17 = pbVar17 + 1) {
    uVar12 = (local_88->m_vertex_faces).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[(pbVar17->field_0).field_0.v[0]];
    while (uVar12 != 0xffffffff) {
      pbVar24 = (local_80->
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar12;
      bVar11 = b_face::is_back(pbVar17,pbVar24,&this->m_normals,local_b0._0_4_);
      if (bVar11) {
        *(uint *)((long)local_a8 + uVar20 * 4) = uVar12;
        *(int *)((long)local_a8 + (ulong)uVar12 * 4) = (int)uVar20;
        break;
      }
      uVar12 = b_face::next_face_idx(pbVar24,(ulong)(pbVar17->field_0).field_0.v[0]);
    }
    uVar20 = (ulong)((int)uVar20 + 1);
  }
  create_edges(local_88,false);
  adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&adjacents,0x200);
  sides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  sides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&sides,0x100);
  uVar21 = local_70;
  pvVar15 = operator_new__((ulong)local_b8);
  std::__fill_n_a<unsigned_int*,unsigned_long,unsigned_int>(pvVar15,uVar21,&BAD_IDX);
  uVar20 = 0;
  local_90 = 0;
  local_b0 = pvVar15;
LAB_0016497d:
  if (uVar20 != uVar21) {
    if ((*(int *)((long)local_a8 + uVar20 * 4) != -1) &&
       (*(int *)((long)pvVar15 + uVar20 * 4) == -1)) {
      side = 0;
      lVar14 = (uVar20 & 0xffffffff) * 4;
      *(int *)((long)pvVar15 + lVar14) = (int)local_90;
      local_74 = (int)local_90 + 1;
      *(int *)((long)pvVar15 + (ulong)*(uint *)((long)local_a8 + lVar14) * 4) = local_74;
      uVar16 = uVar20 & 0xffffffff;
      do {
        pbVar25 = (local_80->
                  super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_b8 = pbVar25 + uVar16;
        pbVar17 = (b_face *)0x3;
        uVar21 = (ulong)pbVar25[uVar16].field_0.field_0.v[0];
        pbVar25 = local_b8;
LAB_001649f0:
        v1 = uVar21;
        uVar21 = local_70;
        if (pbVar17 != (b_face *)0x0) {
          uVar12 = *(uint *)((long)pbVar25 + (long)pbVar17 * 4 + -4);
          uVar21 = (ulong)uVar12;
          pbVar18 = find_edge(local_88,uVar21,v1);
          if ((pbVar18 == (b_edge *)0x0) || (v1 != pbVar18->v1 && uVar12 != pbVar18->v1)) {
            __assert_fail("edge && (v0 == edge->v1 || v1 == edge->v1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                          ,0x14c,"void xray_re::xr_mesh_builder::remove_back_faces(float)");
          }
          pbVar17 = (b_face *)((long)&pbVar17[-1].sector + 1);
          if (pbVar18->size < 5) {
            uVar26 = (ulong)pbVar18->face0;
            local_98 = pbVar17;
            do {
              pbVar17 = local_98;
              pbVar25 = local_b8;
              if (uVar26 == 0xffffffff) break;
              pbVar24 = (local_80->
                        super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar26;
              if (((uVar26 != uVar16) && (uVar26 != *(uint *)((long)local_a8 + uVar16 * 4))) &&
                 (*(int *)((long)local_b0 + uVar26 * 4) == -1)) {
                bVar11 = b_face::is_same_layer(pbVar24,uVar21,v1);
                uVar12 = *(uint *)((long)local_a8 + uVar26 * 4);
                uVar19 = (ulong)uVar12;
                if (uVar19 != 0xffffffff) {
                  piVar22 = (int *)((long)local_b0 + uVar26 * 4);
                  if (bVar11) {
                    local_9c = (uint)uVar26;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    emplace_back<unsigned_int>(&adjacents,&local_9c);
                    *piVar22 = (int)local_90;
                    piVar22 = (int *)((long)local_b0 + uVar19 * 4);
                  }
                  else {
                    local_9c = uVar12;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    emplace_back<unsigned_int>(&adjacents,&local_9c);
                    *(int *)((long)local_b0 + uVar19 * 4) = (int)local_90;
                  }
                  *piVar22 = local_74;
                  pbVar17 = local_98;
                  pbVar25 = local_b8;
                  break;
                }
                pbVar17 = local_98;
                pbVar25 = local_b8;
                if (3 < pbVar18->size) break;
                side = side + (-(uint)bVar11 | 1);
              }
              uVar13 = b_face::next_face_idx(pbVar24,uVar21,v1);
              bVar11 = uVar26 != uVar13;
              pbVar17 = local_98;
              pbVar25 = local_b8;
              uVar26 = (ulong)uVar13;
            } while (bVar11);
          }
          goto LAB_001649f0;
        }
        if (adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00164b76;
        uVar16 = (ulong)adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1];
        adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
      } while( true );
    }
    goto LAB_00164bb0;
  }
  pbVar17 = (local_88->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar24 = (local_88->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = 0;
  __first._M_current = pbVar17;
  do {
    if (pbVar17 == pbVar24) {
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      erase(local_80,__first,
            (local_88->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish);
      operator_delete__(pvVar15);
      operator_delete__(local_a8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sides.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return;
    }
    if (*(int *)((long)local_a8 + (ulong)uVar12 * 4) == -1) {
LAB_00164c11:
      if (pbVar17 != __first._M_current) {
        uVar3 = *(undefined8 *)&pbVar17->field_0;
        uVar4 = *(undefined8 *)((long)&pbVar17->field_0 + 8);
        uVar5 = *(undefined8 *)((long)&pbVar17->field_0 + 0x10);
        uVar6 = *(undefined8 *)((long)&pbVar17->field_0 + 0x18);
        uVar7 = *(undefined8 *)((long)&pbVar17->field_0 + 0x20);
        uVar8 = *(undefined8 *)((long)&pbVar17->field_0 + 0x28);
        uVar13 = pbVar17->tag;
        uVar9 = pbVar17->temp;
        uVar10 = pbVar17->sector;
        (__first._M_current)->field_1 = pbVar17->field_1;
        (__first._M_current)->tag = uVar13;
        (__first._M_current)->temp = uVar9;
        (__first._M_current)->sector = uVar10;
        *(undefined8 *)((long)&(__first._M_current)->field_0 + 0x20) = uVar7;
        *(undefined8 *)((long)&(__first._M_current)->field_0 + 0x28) = uVar8;
        *(undefined8 *)((long)&(__first._M_current)->field_0 + 0x10) = uVar5;
        *(undefined8 *)((long)&(__first._M_current)->field_0 + 0x18) = uVar6;
        *(undefined8 *)&(__first._M_current)->field_0 = uVar3;
        *(undefined8 *)((long)&(__first._M_current)->field_0 + 8) = uVar4;
      }
      __first._M_current = __first._M_current + 1;
    }
    else {
      uVar2 = *(uint *)((long)pvVar15 + (ulong)uVar12 * 4);
      iVar23 = -sides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar2 >> 1];
      if ((uVar2 & 1) == 0) {
        iVar23 = sides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar2 >> 1];
      }
      if (iVar23 < 0) {
        pbVar1 = (byte *)((long)&pbVar17->field_1 + 6);
        *pbVar1 = *pbVar1 | 8;
        goto LAB_00164c11;
      }
    }
    pbVar17 = pbVar17 + 1;
    uVar12 = uVar12 + 1;
  } while( true );
LAB_00164b76:
  if (side == 0) {
    side = -1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&sides,&side);
  local_90 = (ulong)((int)local_90 + 2);
  pvVar15 = local_b0;
LAB_00164bb0:
  uVar20 = uVar20 + 1;
  goto LAB_0016497d;
}

Assistant:

void xr_mesh_builder::remove_back_faces(float normal_tolerance)
{
	generate_vertex_faces();

	size_t num_faces = m_faces.size();

	uint32_t* face_backs = new uint32_t[num_faces];
	xr_uninitialized_fill_n(face_backs, num_faces, BAD_IDX);
	uint32_t face_idx = 0;
	for (b_face_vec_cit it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face& face = m_faces[next];
			if (it->is_back(face, m_normals, normal_tolerance)) {
				face_backs[face_idx] = uint32_t(next & UINT32_MAX);
				face_backs[next] = face_idx;
				break;
			}
			next = face.next_face_idx(it->v0);
		}
	}

	create_edges();

	std::vector<uint32_t> adjacents;
	adjacents.reserve(512);
	std::vector<int> sides;
	sides.reserve(256);

	uint32_t* lgroups = new uint32_t[num_faces];
	xr_uninitialized_fill_n(lgroups, num_faces, BAD_IDX);

	uint32_t lgroup = 0;
	for (size_t k = 0; k != num_faces; ++k) {
		if (face_backs[k] == BAD_IDX || lgroups[k] != BAD_IDX)
			continue;
		int side = 0;
		face_idx = uint32_t(k & UINT32_MAX);
		lgroups[face_idx] = lgroup;
		lgroups[face_backs[face_idx]] = lgroup + 1;
		for (;;) {
			const b_face& face = m_faces[face_idx];
			for (uint_fast32_t i = 3, v0, v1 = face.v0; i != 0; v1 = v0) {
				b_edge* edge = find_edge(v0 = face.v[--i], v1);
				xr_assert(edge && (v0 == edge->v1 || v1 == edge->v1));
				if (edge->size > 4)
					continue;
				for (uint_fast32_t next = edge->face0; next != BAD_IDX;) {
					const b_face& adjacent = m_faces[next];
					if (next != face_idx && next != face_backs[face_idx] &&
							lgroups[next] == BAD_IDX) {
						bool same_layer = adjacent.is_same_layer(v0, v1);
						uint_fast32_t next_back = face_backs[next];
						if (next_back == BAD_IDX) {
							if (edge->size > 3)
								break;
							if (same_layer)
								--side;
							else
								++side;
						} else if (same_layer) {
							adjacents.push_back(uint32_t(next & UINT32_MAX));
							lgroups[next] = lgroup;
							lgroups[next_back] = lgroup + 1;
							break;
						} else {
							adjacents.push_back(uint32_t(next_back & UINT32_MAX));
							lgroups[next_back] = lgroup;
							lgroups[next] = lgroup + 1;
							break;
						}
					}

					// check for endless cycle. It`s in build 2232 l06_rostok
					uint_fast32_t temp = adjacent.next_face_idx(v0, v1);
					if (next == temp)
						break;
					next = temp;
				}
			}
			if (adjacents.empty())
				break;
			face_idx = adjacents.back();
			adjacents.pop_back();

		}
		if (side == 0)
			side = -1;
		sides.push_back(side);
		lgroup += 2;
	}

	face_idx = 0;
	b_face_vec_it last = m_faces.begin();
	for (b_face_vec_it it = last, end = m_faces.end(); it != end; ++it, ++face_idx) {
		if (face_backs[face_idx] != BAD_IDX) {
			int side = sides[(lgroup = lgroups[face_idx])/2];
			if (lgroup & 1)
				side = -side;
			if (side < 0)
				it->surface.flags |= RSF_TWO_SIDED;
			else
				continue;
		}
		if (last != it)
			*last = *it;
		++last;
	}
	m_faces.erase(last, m_faces.end());

	delete[] lgroups;
	delete[] face_backs;
}